

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_iejoin.cpp
# Opt level: O2

void __thiscall
duckdb::PhysicalIEJoin::ResolveComplexJoin
          (PhysicalIEJoin *this,ExecutionContext *context,DataChunk *result,
          LocalSourceState *state_p)

{
  DataChunk *this_00;
  _Head_base<0UL,_bool_*,_false> _Var1;
  pointer ptr;
  pointer pGVar2;
  reference pvVar3;
  type pGVar4;
  type pGVar5;
  const_reference pvVar6;
  idx_t left_cols;
  pointer this_01;
  SelectionVector *sel_vector;
  ulong uVar7;
  reference result_00;
  reference result_01;
  const_reference pvVar8;
  _func_int **pp_Var9;
  long lVar10;
  _func_int **pp_Var11;
  size_t cmp_idx;
  size_type __n;
  bool bVar12;
  _func_int **local_158;
  SelectionVector rsel;
  SelectionVector lsel;
  BufferHandle local_a0;
  BufferHandle local_88;
  DataChunk right_chunk;
  
  pGVar2 = unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>::
           operator->(&(this->super_PhysicalRangeJoin).super_PhysicalComparisonJoin.
                       super_PhysicalJoin.super_CachingPhysicalOperator.super_PhysicalOperator.
                       sink_state);
  pvVar3 = vector<duckdb::unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>,_true>
           ::get<true>((vector<duckdb::unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>,_true>
                        *)(pGVar2 + 1),0);
  pGVar4 = unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>
           ::operator*(pvVar3);
  pvVar3 = vector<duckdb::unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>,_true>
           ::get<true>((vector<duckdb::unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>,_true>
                        *)(pGVar2 + 1),1);
  pGVar5 = unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>
           ::operator*(pvVar3);
  pvVar6 = vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true>::get<true>
                     (&(this->super_PhysicalRangeJoin).super_PhysicalComparisonJoin.
                       super_PhysicalJoin.super_CachingPhysicalOperator.super_PhysicalOperator.
                       children,0);
  left_cols = ((long)(pvVar6->_M_data->types).
                     super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                     super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
              (long)(pvVar6->_M_data->types).
                    super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    _M_impl.super__Vector_impl_data._M_start) / 0x18;
  this_00 = (DataChunk *)(state_p + 0x2c);
  do {
    SelectionVector::SelectionVector(&lsel,0x800);
    SelectionVector::SelectionVector(&rsel,0x800);
    this_01 = unique_ptr<duckdb::IEJoinUnion,_std::default_delete<duckdb::IEJoinUnion>,_true>::
              operator->((unique_ptr<duckdb::IEJoinUnion,_std::default_delete<duckdb::IEJoinUnion>,_true>
                          *)(state_p + 2));
    local_158 = (_func_int **)IEJoinUnion::JoinComplexBlocks(this_01,&lsel,&rsel);
    if (local_158 == (_func_int **)0x0) {
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&rsel.selection_data.internal.
                  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
      ;
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&lsel.selection_data.internal.
                  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
      ;
      return;
    }
    DataChunk::Reset(this_00);
    PhysicalRangeJoin::SliceSortedPayload
              (&local_88,this_00,&pGVar4->global_sort_state,(idx_t)state_p[4]._vptr_LocalSourceState
               ,&lsel,(idx_t)local_158,0);
    BufferHandle::~BufferHandle(&local_88);
    PhysicalRangeJoin::SliceSortedPayload
              (&local_a0,this_00,&pGVar5->global_sort_state,(idx_t)state_p[6]._vptr_LocalSourceState
               ,&rsel,(idx_t)local_158,left_cols);
    BufferHandle::~BufferHandle(&local_a0);
    state_p[0x2f]._vptr_LocalSourceState = local_158;
    sel_vector = FlatVector::IncrementalSelectionVector();
    uVar7 = ((long)*(pointer *)
                    ((long)&(this->super_PhysicalRangeJoin).super_PhysicalComparisonJoin.conditions.
                            super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>
                            .
                            super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>
                            ._M_impl.super__Vector_impl_data + 8) -
            (long)(this->super_PhysicalRangeJoin).super_PhysicalComparisonJoin.conditions.
                  super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
                  super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
                  _M_impl.super__Vector_impl_data._M_start) / 0x18;
    if (2 < uVar7) {
      DataChunk::DataChunk(&right_chunk);
      DataChunk::Split(this_00,&right_chunk,left_cols);
      lVar10 = uVar7 - 2;
      state_p[0xd]._vptr_LocalSourceState = (_func_int **)this_00;
      state_p[0x1e]._vptr_LocalSourceState = (_func_int **)&right_chunk;
      __n = 0;
      pp_Var9 = local_158;
      while (bVar12 = lVar10 != 0, lVar10 = lVar10 + -1, bVar12) {
        result_00 = vector<duckdb::Vector,_true>::get<true>
                              ((vector<duckdb::Vector,_true> *)(state_p + 0x13),__n);
        ExpressionExecutor::ExecuteExpression((ExpressionExecutor *)(state_p + 10),__n,result_00);
        result_01 = vector<duckdb::Vector,_true>::get<true>
                              ((vector<duckdb::Vector,_true> *)(state_p + 0x24),__n);
        ExpressionExecutor::ExecuteExpression((ExpressionExecutor *)(state_p + 0x1b),__n,result_01);
        if (pp_Var9 < local_158) {
          Vector::Slice(result_00,sel_vector,(idx_t)pp_Var9);
          Vector::Slice(result_01,sel_vector,(idx_t)pp_Var9);
        }
        pvVar8 = vector<duckdb::JoinCondition,_true>::get<true>
                           (&(this->super_PhysicalRangeJoin).super_PhysicalComparisonJoin.conditions
                            ,__n + 2);
        pp_Var9 = (_func_int **)
                  PhysicalRangeJoin::SelectJoinTail
                            (&pvVar8->comparison,result_00,result_01,sel_vector,(idx_t)pp_Var9,
                             (SelectionVector *)(state_p + 7));
        __n = __n + 1;
        sel_vector = (SelectionVector *)(state_p + 7);
      }
      DataChunk::Fuse(this_00,&right_chunk);
      if (pp_Var9 < local_158) {
        DataChunk::Slice(this_00,sel_vector,(idx_t)pp_Var9);
        local_158 = pp_Var9;
      }
      DataChunk::~DataChunk(&right_chunk);
    }
    PhysicalRangeJoin::ProjectResult(&this->super_PhysicalRangeJoin,this_00,result);
    _Var1._M_head_impl =
         (pGVar4->found_match).super_unique_ptr<bool[],_std::default_delete<bool[]>_>._M_t.
         super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
         super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
         super__Head_base<0UL,_bool_*,_false>._M_head_impl;
    if (_Var1._M_head_impl != (bool *)0x0) {
      for (pp_Var9 = (_func_int **)0x0; local_158 != pp_Var9;
          pp_Var9 = (_func_int **)((long)pp_Var9 + 1)) {
        pp_Var11 = pp_Var9;
        if (sel_vector->sel_vector != (sel_t *)0x0) {
          pp_Var11 = (_func_int **)(ulong)sel_vector->sel_vector[(long)pp_Var9];
        }
        *(bool *)((long)state_p[3]._vptr_LocalSourceState +
                 (long)(_Var1._M_head_impl + lsel.sel_vector[(long)pp_Var11])) = true;
      }
    }
    _Var1._M_head_impl =
         (pGVar5->found_match).super_unique_ptr<bool[],_std::default_delete<bool[]>_>._M_t.
         super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
         super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
         super__Head_base<0UL,_bool_*,_false>._M_head_impl;
    if (_Var1._M_head_impl != (bool *)0x0) {
      for (pp_Var9 = (_func_int **)0x0; local_158 != pp_Var9;
          pp_Var9 = (_func_int **)((long)pp_Var9 + 1)) {
        pp_Var11 = pp_Var9;
        if (sel_vector->sel_vector != (sel_t *)0x0) {
          pp_Var11 = (_func_int **)(ulong)sel_vector->sel_vector[(long)pp_Var9];
        }
        *(bool *)((long)state_p[5]._vptr_LocalSourceState +
                 (long)(_Var1._M_head_impl + rsel.sel_vector[(long)pp_Var11])) = true;
      }
    }
    DataChunk::Verify(result);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&rsel.selection_data.internal.
                super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&lsel.selection_data.internal.
                super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  } while (result->count == 0);
  return;
}

Assistant:

void PhysicalIEJoin::ResolveComplexJoin(ExecutionContext &context, DataChunk &result, LocalSourceState &state_p) const {
	auto &state = state_p.Cast<IEJoinLocalSourceState>();
	auto &ie_sink = sink_state->Cast<IEJoinGlobalState>();
	auto &left_table = *ie_sink.tables[0];
	auto &right_table = *ie_sink.tables[1];

	const auto left_cols = children[0].get().GetTypes().size();
	auto &chunk = state.unprojected;
	do {
		SelectionVector lsel(STANDARD_VECTOR_SIZE);
		SelectionVector rsel(STANDARD_VECTOR_SIZE);
		auto result_count = state.joiner->JoinComplexBlocks(lsel, rsel);
		if (result_count == 0) {
			// exhausted this pair
			return;
		}

		// found matches: extract them

		chunk.Reset();
		SliceSortedPayload(chunk, left_table.global_sort_state, state.left_block_index, lsel, result_count, 0);
		SliceSortedPayload(chunk, right_table.global_sort_state, state.right_block_index, rsel, result_count,
		                   left_cols);
		chunk.SetCardinality(result_count);

		auto sel = FlatVector::IncrementalSelectionVector();
		if (conditions.size() > 2) {
			// If there are more expressions to compute,
			// split the result chunk into the left and right halves
			// so we can compute the values for comparison.
			const auto tail_cols = conditions.size() - 2;

			DataChunk right_chunk;
			chunk.Split(right_chunk, left_cols);
			state.left_executor.SetChunk(chunk);
			state.right_executor.SetChunk(right_chunk);

			auto tail_count = result_count;
			auto true_sel = &state.true_sel;
			for (size_t cmp_idx = 0; cmp_idx < tail_cols; ++cmp_idx) {
				auto &left = state.left_keys.data[cmp_idx];
				state.left_executor.ExecuteExpression(cmp_idx, left);

				auto &right = state.right_keys.data[cmp_idx];
				state.right_executor.ExecuteExpression(cmp_idx, right);

				if (tail_count < result_count) {
					left.Slice(*sel, tail_count);
					right.Slice(*sel, tail_count);
				}
				tail_count = SelectJoinTail(conditions[cmp_idx + 2].comparison, left, right, sel, tail_count, true_sel);
				sel = true_sel;
			}
			chunk.Fuse(right_chunk);

			if (tail_count < result_count) {
				result_count = tail_count;
				chunk.Slice(*sel, result_count);
			}
		}

		//	We need all of the data to compute other predicates,
		//	but we only return what is in the projection map
		ProjectResult(chunk, result);

		// found matches: mark the found matches if required
		if (left_table.found_match) {
			for (idx_t i = 0; i < result_count; i++) {
				left_table.found_match[state.left_base + lsel[sel->get_index(i)]] = true;
			}
		}
		if (right_table.found_match) {
			for (idx_t i = 0; i < result_count; i++) {
				right_table.found_match[state.right_base + rsel[sel->get_index(i)]] = true;
			}
		}
		result.Verify();
	} while (result.size() == 0);
}